

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_table.c
# Opt level: O3

void llmsset_free(llmsset_t_conflict dbs)

{
  munmap(dbs->table,dbs->max_size * 8 + 0x3f & 0xffffffffffffffc0);
  munmap(dbs->data,dbs->max_size * 0x10 + 0x3f & 0xffffffffffffffc0);
  munmap(dbs->bitmap1,(dbs->max_size >> 0xc) + 0x3f & 0xffffffffffffffc0);
  munmap(dbs->bitmap2,(dbs->max_size >> 3) + 0x3f & 0xffffffffffffffc0);
  munmap(dbs->bitmapc,(dbs->max_size >> 3) + 0x3f & 0xffffffffffffffc0);
  munmap(dbs,0x80);
  return;
}

Assistant:

void
llmsset_free(llmsset_t dbs)
{
    free_aligned(dbs->table, dbs->max_size * 8);
    free_aligned(dbs->data, dbs->max_size * 16);
    free_aligned(dbs->bitmap1, dbs->max_size / (512*8));
    free_aligned(dbs->bitmap2, dbs->max_size / 8);
    free_aligned(dbs->bitmapc, dbs->max_size / 8);
    free_aligned(dbs, sizeof(struct llmsset));
}